

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample1DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,IVec2 *offset)

{
  WrapMode WVar1;
  undefined1 auVar2 [16];
  float afVar3 [4];
  undefined1 auVar4 [16];
  WrapMode WVar5;
  WrapMode WVar6;
  TextureChannelClass TVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  IVec2 *offset_00;
  Vector<float,_4> *res;
  WrapMode WVar11;
  WrapMode WVar12;
  int i;
  WrapMode WVar13;
  int *in_R8;
  uint uVar14;
  float fVar15;
  undefined1 in_register_00001204 [12];
  uint uVar16;
  float fVar18;
  float fVar23;
  float fVar17;
  float fVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar25;
  Vec4 VVar26;
  Vec4 VVar27;
  Vec4 p0;
  Vec4 p1;
  undefined1 local_68 [16];
  undefined1 local_58 [20];
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  Vec4 VVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  
  offset_00 = (IVec2 *)CONCAT44(in_register_00000014,filter);
  uVar10 = in_register_00001204._0_4_;
  auVar19._0_8_ = CONCAT44(uVar10,s);
  uVar8 = in_register_00001204._4_4_;
  auVar19._8_4_ = uVar8;
  uVar16 = in_register_00001204._8_4_;
  auVar19._12_4_ = uVar16;
  if ((char)offset_00[3].m_data[0] == '\x01') {
    uVar14 = offset_00->m_data[0];
    auVar20._4_12_ = auVar19._4_12_;
    if (uVar14 < 7) {
      WVar1 = sampler->wrapR;
      if ((0x57U >> (uVar14 & 0x1f) & 1) == 0) {
        if (uVar14 == 3) {
          fVar17 = floorf(s);
          auVar21._0_4_ = s - fVar17;
          auVar21._4_12_ = auVar20._4_12_;
        }
        else {
          fVar17 = s * 0.5;
          fVar15 = floorf(fVar17);
          if ((fVar17 - fVar15 != 0.5) || (NAN(fVar17 - fVar15))) {
            fVar15 = floorf(fVar17 + 0.5);
          }
          else {
            fVar15 = 0.0;
            if (((long)(fVar17 + -0.5) & 1U) != 0) {
              fVar15 = 1.0;
            }
            fVar15 = fVar17 + -0.5 + fVar15;
          }
          fVar17 = s - (fVar15 + fVar15);
          uVar14 = -(uint)(-fVar17 <= fVar17);
          auVar2._4_4_ = uVar10 & (uVar10 ^ 0x80000000);
          auVar2._0_4_ = (uint)fVar17 & uVar14;
          auVar2._8_4_ = uVar8 & (uVar8 ^ 0x80000000);
          auVar2._12_4_ = uVar16 & (uVar16 ^ 0x80000000);
          auVar21 = ZEXT416(~uVar14 & (uint)-fVar17) | auVar2;
        }
        auVar22._4_12_ = auVar21._4_12_;
        auVar22._0_4_ = auVar21._0_4_ * (float)(int)WVar1;
        auVar19._0_8_ = auVar22._0_8_;
      }
      else {
        auVar20._0_4_ = s * (float)(int)WVar1;
        auVar19._0_8_ = auVar20._0_8_;
      }
    }
    else {
      auVar19._0_8_ = 0;
    }
  }
  if ((int)offset == 0) {
    VVar26 = sampleNearest1D(this,sampler,(float)auVar19._0_8_,offset_00);
    VVar26.m_data[0] = VVar26.m_data[0];
    VVar27.m_data[1] = VVar26.m_data[1];
    register0x00001240 = VVar26.m_data[2];
    register0x00001244 = VVar26.m_data[3];
    return (Vec4)VVar26.m_data;
  }
  if ((int)offset != 1) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar19._0_8_;
    afVar3 = (float  [4])(auVar4 << 0x40);
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    VVar28.m_data[0] = afVar3[0];
    VVar27.m_data[1] = afVar3[1];
    register0x00001240 = afVar3[2];
    register0x00001244 = afVar3[3];
    return (Vec4)VVar28.m_data;
  }
  WVar1 = sampler->wrapR;
  fVar17 = (float)auVar19._0_8_ + -0.5;
  fVar15 = floorf(fVar17);
  WVar12 = *in_R8 + (int)fVar15 + CLAMP_TO_BORDER;
  uVar10 = offset_00->m_data[0];
  WVar13 = CLAMP_TO_EDGE;
  i = (int)sampler;
  if (6 < uVar10) {
LAB_008f716a:
    WVar5 = WVar12;
    if (uVar10 != 4) {
      if (uVar10 != 6) {
        WVar11 = CLAMP_TO_EDGE;
        if (uVar10 == 5) goto LAB_008f7180;
        goto LAB_008f71d1;
      }
      WVar5 = WVar1;
      if ((int)WVar12 < (int)WVar1) {
        WVar5 = WVar12;
      }
      if (SBORROW4(WVar12,-WVar1) != (int)(WVar12 + WVar1) < 0) {
        WVar5 = -WVar1;
      }
    }
    iVar9 = (int)WVar5 % (int)(WVar1 * 2);
    uVar10 = (iVar9 - WVar1) + (iVar9 >> 0x1f & WVar1 * 2);
    WVar11 = ~((int)uVar10 >> 0x1f ^ uVar10) + WVar1;
    goto LAB_008f71d1;
  }
  WVar5 = *in_R8 + (int)fVar15;
  WVar13 = WVar5;
  switch(uVar10) {
  case 0:
    WVar11 = WVar1 - CLAMP_TO_BORDER;
    WVar13 = WVar11;
    if ((int)WVar5 < (int)WVar11) {
      WVar13 = WVar5;
    }
    if ((int)WVar5 < 0) {
      WVar13 = CLAMP_TO_EDGE;
    }
    if ((int)WVar12 < (int)WVar11) {
      WVar11 = WVar12;
    }
    if ((int)WVar12 < 0) {
      WVar11 = CLAMP_TO_EDGE;
    }
    break;
  case 1:
    WVar13 = WVar1;
    if ((int)WVar5 < (int)WVar1) {
      WVar13 = WVar5;
    }
    WVar6 = WVar13;
    if ((int)WVar5 < -1) {
      WVar6 = ~CLAMP_TO_EDGE;
    }
    WVar11 = WVar1;
    if ((int)WVar12 < (int)WVar1) {
      WVar11 = WVar12;
    }
    WVar5 = ~CLAMP_TO_EDGE;
    if (-2 < (int)WVar12) {
      WVar5 = WVar11;
    }
    if ((int)WVar6 < (int)WVar1 && -1 < (int)WVar6) {
      lookup((ConstPixelBufferAccess *)local_68,i,WVar13,in_R8[1]);
    }
    else {
      TVar7 = getTextureChannelClass(sampler->wrapT);
      switch(TVar7) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        sampleTextureBorder<float>((TextureFormat *)local_68,sampler);
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        sampleTextureBorder<int>((TextureFormat *)(local_58 + 0x10),sampler);
        local_68._0_4_ = (undefined4)(int)local_58._16_4_;
        local_68._4_4_ = (undefined4)(int)uStack_44;
        local_68._8_4_ = (undefined4)(int)uStack_40;
        local_68._12_4_ = (undefined4)(int)uStack_3c;
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        sampleTextureBorder<unsigned_int>((TextureFormat *)(local_58 + 0x10),sampler);
        local_68._0_4_ =
             ((float)((uint)local_58._16_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(local_58._16_4_ & 0xffff | 0x4b000000);
        local_68._4_4_ =
             ((float)(uStack_44 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uStack_44 & 0xffff | 0x4b000000);
        local_68._8_4_ =
             ((float)(uStack_40 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uStack_40 & 0xffff | 0x4b000000);
        local_68._12_4_ =
             ((float)(uStack_3c >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uStack_3c & 0xffff | 0x4b000000);
        break;
      default:
        local_68._0_4_ = -1.0;
        local_68._4_4_ = -1.0;
        local_68._8_4_ = -1.0;
        local_68._12_4_ = -1.0;
      }
    }
    if ((int)WVar1 <= (int)WVar5 || (int)WVar5 < 0) {
      TVar7 = getTextureChannelClass(sampler->wrapT);
      switch(TVar7) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        sampleTextureBorder<float>((TextureFormat *)local_58,sampler);
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        sampleTextureBorder<int>((TextureFormat *)(local_58 + 0x10),sampler);
        local_58._0_4_ = (undefined4)(int)local_58._16_4_;
        local_58._4_4_ = (undefined4)(int)uStack_44;
        local_58._8_4_ = (undefined4)(int)uStack_40;
        local_58._12_4_ = (undefined4)(int)uStack_3c;
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        sampleTextureBorder<unsigned_int>((TextureFormat *)(local_58 + 0x10),sampler);
        local_58._0_4_ =
             ((float)((uint)local_58._16_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(local_58._16_4_ & 0xffff | 0x4b000000);
        local_58._4_4_ =
             ((float)(uStack_44 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uStack_44 & 0xffff | 0x4b000000);
        local_58._8_4_ =
             ((float)(uStack_40 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uStack_40 & 0xffff | 0x4b000000);
        local_58._12_4_ =
             ((float)(uStack_3c >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uStack_3c & 0xffff | 0x4b000000);
        break;
      default:
        local_58._0_4_ = -1.0;
        local_58._4_4_ = -1.0;
        local_58._8_4_ = -1.0;
        local_58._12_4_ = -1.0;
      }
      goto LAB_008f7206;
    }
    goto LAB_008f71f0;
  default:
    WVar13 = ((int)WVar5 % (int)WVar1 >> 0x1f & WVar1) + (int)WVar5 % (int)WVar1;
    WVar11 = ((int)WVar12 % (int)WVar1 >> 0x1f & WVar1) + (int)WVar12 % (int)WVar1;
    break;
  case 5:
    WVar11 = WVar1 - CLAMP_TO_BORDER;
    if ((int)WVar5 < (int)(WVar1 - CLAMP_TO_BORDER)) {
      WVar11 = WVar5;
    }
    WVar13 = CLAMP_TO_EDGE;
    if (-1 < (int)WVar5) {
      WVar13 = WVar11;
    }
LAB_008f7180:
    WVar5 = WVar1 - CLAMP_TO_BORDER;
    if ((int)WVar12 < (int)(WVar1 - CLAMP_TO_BORDER)) {
      WVar5 = WVar12;
    }
    WVar11 = CLAMP_TO_EDGE;
    if (-1 < (int)WVar12) {
      WVar11 = WVar5;
    }
    break;
  case 6:
    WVar13 = WVar1;
    if ((int)WVar5 < (int)WVar1) {
      WVar13 = WVar5;
    }
    if (SBORROW4(WVar5,-WVar1) != (int)(WVar5 + WVar1) < 0) {
      WVar13 = -WVar1;
    }
  case 4:
    iVar9 = (int)WVar13 % (int)(WVar1 * 2);
    uVar8 = (iVar9 - WVar1) + (iVar9 >> 0x1f & WVar1 * 2);
    WVar13 = ~((int)uVar8 >> 0x1f ^ uVar8) + WVar1;
    goto LAB_008f716a;
  }
LAB_008f71d1:
  lookup((ConstPixelBufferAccess *)local_68,i,WVar13,in_R8[1]);
LAB_008f71f0:
  lookup((ConstPixelBufferAccess *)local_58,i,WVar11,in_R8[1]);
LAB_008f7206:
  fVar17 = fVar17 - fVar15;
  fVar15 = 1.0 - fVar17;
  fVar18 = fVar17 * (float)local_58._0_4_ + fVar15 * (float)local_68._0_4_;
  fVar23 = fVar17 * (float)local_58._4_4_ + fVar15 * (float)local_68._4_4_;
  fVar24 = fVar17 * (float)local_58._8_4_ + fVar15 * (float)local_68._8_4_;
  fVar25 = fVar17 * (float)local_58._12_4_ + fVar15 * (float)local_68._12_4_;
  (this->m_format).order = (ChannelOrder)fVar18;
  (this->m_format).type = (ChannelType)fVar23;
  (this->m_size).m_data[0] = (int)fVar24;
  (this->m_size).m_data[1] = (int)fVar25;
  VVar27.m_data[0] = fVar15 * (float)local_68._0_4_;
  VVar27.m_data[1] = fVar15 * (float)local_68._4_4_;
  register0x00001240 = fVar18;
  register0x00001244 = fVar23;
  return (Vec4)VVar27.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample1DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, const IVec2& offset) const
{
	// check selected layer exists
	// \note offset.x is X offset, offset.y is the selected layer
	DE_ASSERT(de::inBounds(offset.y(), 0, m_size.y()));

	// Non-normalized coordinates.
	float u = s;

	if (sampler.normalizedCoords)
		u = unnormalize(sampler.wrapS, s, m_size.x());

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest1D	(*this, sampler, u, offset);
		case Sampler::LINEAR:	return sampleLinear1D	(*this, sampler, u, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}